

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QWizardField>::copyAppend
          (QGenericArrayOps<QWizardField> *this,QWizardField *b,QWizardField *e)

{
  qsizetype *pqVar1;
  QWizardField *pQVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  QObject *pQVar6;
  undefined7 uVar7;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QWizardField>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QWizardField>).size;
      pQVar2[lVar3].page = b->page;
      pDVar4 = (b->name).d.d;
      pQVar2[lVar3].name.d.d = pDVar4;
      pQVar2[lVar3].name.d.ptr = (b->name).d.ptr;
      pQVar2[lVar3].name.d.size = (b->name).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      uVar7 = *(undefined7 *)&b->field_0x21;
      pQVar6 = b->object;
      pQVar2[lVar3].mandatory = b->mandatory;
      *(undefined7 *)&pQVar2[lVar3].field_0x21 = uVar7;
      pQVar2[lVar3].object = pQVar6;
      pDVar5 = (b->property).d.d;
      pQVar2[lVar3].property.d.d = pDVar5;
      pQVar2[lVar3].property.d.ptr = (b->property).d.ptr;
      pQVar2[lVar3].property.d.size = (b->property).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar5 = (b->changedSignal).d.d;
      pQVar2[lVar3].changedSignal.d.d = pDVar5;
      pQVar2[lVar3].changedSignal.d.ptr = (b->changedSignal).d.ptr;
      pQVar2[lVar3].changedSignal.d.size = (b->changedSignal).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ::QVariant::QVariant(&pQVar2[lVar3].initialValue,&b->initialValue);
      pqVar1 = &(this->super_QArrayDataPointer<QWizardField>).size;
      *pqVar1 = *pqVar1 + 1;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }